

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O0

void anurbs::Triangle<3L>::register_python(module *m)

{
  char *name_00;
  arg aVar1;
  undefined1 local_d0;
  arg local_c8;
  arg local_b8;
  arg local_a8;
  arg local_98;
  arg local_88;
  arg local_78;
  arg local_68;
  _func_pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>
  *local_58 [3];
  handle local_40;
  class_<anurbs::Triangle<3L>_> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  Triangle<3l>::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::Triangle<3L>_>::class_<>(&local_38,local_40,name_00);
  local_58[0] = projection;
  local_78 = pybind11::literals::operator____a("point",5);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  local_98 = pybind11::literals::operator____a("a",1);
  local_88.name = local_98.name;
  local_88._8_1_ = local_98._8_1_;
  local_b8 = pybind11::literals::operator____a("b",1);
  local_a8.name = local_b8.name;
  local_a8._8_1_ = local_b8._8_1_;
  aVar1 = pybind11::literals::operator____a("c",1);
  local_c8.name = aVar1.name;
  local_d0 = aVar1._8_1_;
  local_c8._8_1_ = local_d0;
  pybind11::class_<anurbs::Triangle<3l>>::
  def_static<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
            ((class_<anurbs::Triangle<3l>> *)&local_38,"projection",local_58,&local_68,&local_88,
             &local_a8,&local_c8);
  pybind11::class_<anurbs::Triangle<3L>_>::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Triangle<TDimension>;

        const std::string name = Type::python_name();

        pybind11::class_<Type>(m, name.c_str())
            .def_static("projection", &Type::projection, "point"_a, "a"_a, "b"_a, "c"_a)
        ;
    }